

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::stepPositionsMultiDof(btMultiBody *this,btScalar dt,btScalar *pq,btScalar *pqd)

{
  uint uVar1;
  btMultibodyLink *pbVar2;
  int iVar3;
  btVector3 *pbVar4;
  ulong uVar5;
  undefined1 uVar6;
  btScalar *pbVar7;
  float *pfVar8;
  ulong uVar9;
  btQuaternion *pbVar10;
  btScalar (*_angle) [4];
  btScalar *pbVar11;
  btScalar (*pq_00) [4];
  float *pfVar12;
  btVector3 bVar13;
  btVector3 bVar14;
  float local_78;
  float fStack_74;
  float local_68;
  btVector3 q0_coors_qd1qd2;
  btQuaternion local_40;
  
  uVar1 = (this->m_links).m_size;
  pbVar4 = (btVector3 *)(pq + 4);
  if (pq == (btScalar *)0x0) {
    pbVar4 = &this->m_basePos;
  }
  pbVar10 = &this->m_baseQuat;
  if (pq != (btScalar *)0x0) {
    pbVar10 = (btQuaternion *)pq;
  }
  pbVar7 = (this->m_realBuf).m_data;
  if (pqd != (btScalar *)0x0) {
    pbVar7 = pqd;
  }
  pbVar4->m_floats[0] = pbVar7[3] * dt + pbVar4->m_floats[0];
  pbVar4->m_floats[1] = pbVar7[4] * dt + pbVar4->m_floats[1];
  pbVar4->m_floats[2] = pbVar7[5] * dt + pbVar4->m_floats[2];
  pbVar11 = (this->m_realBuf).m_data;
  if (pqd != (btScalar *)0x0) {
    pbVar11 = pqd;
  }
  if (stepPositionsMultiDof(float,float*,float*)::baseQuat == '\0') {
    iVar3 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::baseQuat);
    if (iVar3 != 0) {
      __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::baseQuat);
    }
  }
  uVar6 = SUB81(pbVar7,0);
  stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats =
       *(btQuadWord *)(pbVar10->super_btQuadWord).m_floats;
  if (stepPositionsMultiDof(float,float*,float*)::baseOmega == '\0') {
    iVar3 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::baseOmega);
    if (iVar3 != 0) {
      __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::baseOmega);
    }
  }
  stepPositionsMultiDof::baseOmega.m_floats._0_8_ = *(undefined8 *)pbVar11;
  stepPositionsMultiDof::baseOmega.m_floats[2] = pbVar11[2];
  stepPositionsMultiDof::baseOmega.m_floats[3] = 0.0;
  stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
            ((anon_struct_1_0_00000001 *)&stepPositionsMultiDof::baseOmega,
             (btVector3 *)&stepPositionsMultiDof::baseQuat,(btQuaternion *)0x1,(bool)uVar6,dt);
  pq_00 = (btScalar (*) [4])(pq + 7);
  if (pq == (btScalar *)0x0) {
    pq_00 = (btScalar (*) [4])0x0;
  }
  pfVar12 = pqd + 6;
  (pbVar10->super_btQuadWord).m_floats[0] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[0];
  (pbVar10->super_btQuadWord).m_floats[1] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[1];
  (pbVar10->super_btQuadWord).m_floats[2] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[2];
  if (pqd == (btScalar *)0x0) {
    pfVar12 = (float *)0x0;
  }
  uVar9 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar9;
  }
  (pbVar10->super_btQuadWord).m_floats[3] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[3];
  for (; uVar5 * 600 != uVar9; uVar9 = uVar9 + 600) {
    pbVar2 = (this->m_links).m_data;
    _angle = (btScalar (*) [4])((long)pbVar2->m_jointPos + uVar9);
    if (pq_00 != (btScalar (*) [4])0x0) {
      _angle = pq_00;
    }
    pfVar8 = pfVar12;
    if (pfVar12 == (float *)0x0) {
      pfVar8 = (this->m_realBuf).m_data +
               (long)*(int *)((long)(pbVar2->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                             (uVar9 - 8)) + 6;
    }
    uVar1 = *(uint *)((long)(pbVar2->m_cachedWorldTransform).m_basis.m_el[0].m_floats +
                     (uVar9 - 0xc));
    uVar6 = (undefined1)uVar1;
    if (uVar1 < 2) {
      (*_angle)[0] = *pfVar8 * dt + (*_angle)[0];
    }
    else if (uVar1 == 2) {
      if (stepPositionsMultiDof(float,float*,float*)::jointVel == '\0') {
        iVar3 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::jointVel);
        if (iVar3 != 0) {
          __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::jointVel);
        }
      }
      stepPositionsMultiDof::jointVel.m_floats._0_8_ = *(undefined8 *)pfVar8;
      stepPositionsMultiDof::jointVel.m_floats[2] = pfVar8[2];
      stepPositionsMultiDof::jointVel.m_floats[3] = 0.0;
      if (stepPositionsMultiDof(float,float*,float*)::jointOri == '\0') {
        iVar3 = __cxa_guard_acquire(&stepPositionsMultiDof(float,float*,float*)::jointOri);
        if (iVar3 != 0) {
          __cxa_guard_release(&stepPositionsMultiDof(float,float*,float*)::jointOri);
        }
      }
      stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats = *(btQuadWord *)_angle;
      stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
                ((anon_struct_1_0_00000001 *)&stepPositionsMultiDof::jointVel,
                 (btVector3 *)&stepPositionsMultiDof::jointOri,(btQuaternion *)0x0,(bool)uVar6,dt);
      (*_angle)[0] = stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[0];
      *(btScalar *)((long)*_angle + 4) =
           stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[1];
      *(btScalar *)((long)*_angle + 8) =
           stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[2];
      *(btScalar *)((long)*_angle + 0xc) =
           stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[3];
    }
    else if (uVar1 == 3) {
      pbVar7 = (this->m_realBuf).m_data +
               (long)*(int *)((long)(pbVar2->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                             (uVar9 - 8)) + 7;
      (*_angle)[0] = pbVar7[-1] * dt + (*_angle)[0];
      bVar13 = operator*((btVector3 *)((long)pbVar2->m_axes[1].m_bottomVec.m_floats + uVar9),pbVar7)
      ;
      pbVar2 = (this->m_links).m_data;
      bVar14 = operator*((btVector3 *)((long)pbVar2->m_axes[2].m_bottomVec.m_floats + uVar9),
                         (this->m_realBuf).m_data +
                         (long)*(int *)((long)(pbVar2->m_cachedRotParentToThis).super_btQuadWord.
                                              m_floats + (uVar9 - 8)) + 8);
      local_78 = bVar13.m_floats[0];
      fStack_74 = bVar13.m_floats[1];
      local_68 = bVar13.m_floats[2];
      q0_coors_qd1qd2.m_floats[1] = bVar14.m_floats[1] + fStack_74;
      q0_coors_qd1qd2.m_floats[0] = bVar14.m_floats[0] + local_78;
      q0_coors_qd1qd2.m_floats[2] = bVar14.m_floats[2] + local_68;
      q0_coors_qd1qd2.m_floats[3] = 0.0;
      btQuaternion::setRotation
                (&local_40,
                 (btVector3 *)((long)((this->m_links).m_data)->m_axes[0].m_topVec.m_floats + uVar9),
                 *_angle);
      bVar13 = quatRotate(&local_40,&q0_coors_qd1qd2);
      pbVar2 = (this->m_links).m_data;
      *(float *)((long)*_angle + 4) =
           (*(float *)((long)pbVar2->m_axes[1].m_bottomVec.m_floats + uVar9 + 8) *
            bVar13.m_floats[2] +
           *(float *)((long)pbVar2->m_axes[1].m_bottomVec.m_floats + uVar9) * bVar13.m_floats[0] +
           *(float *)((long)pbVar2->m_axes[1].m_bottomVec.m_floats + uVar9 + 4) * bVar13.m_floats[1]
           ) * dt + *(btScalar *)((long)*_angle + 4);
      *(float *)((long)*_angle + 8) =
           (bVar13.m_floats[2] *
            *(float *)((long)pbVar2->m_axes[2].m_bottomVec.m_floats + uVar9 + 8) +
           *(float *)((long)pbVar2->m_axes[2].m_bottomVec.m_floats + uVar9) * bVar13.m_floats[0] +
           bVar13.m_floats[1] * *(float *)((long)pbVar2->m_axes[2].m_bottomVec.m_floats + uVar9 + 4)
           ) * dt + *(btScalar *)((long)*_angle + 8);
    }
    btMultibodyLink::updateCacheMultiDof
              ((btMultibodyLink *)
               ((long)(((this->m_links).m_data)->m_inertiaLocal).m_floats + (uVar9 - 4)),*pq_00);
    if (pq_00 == (btScalar (*) [4])0x0) {
      pq_00 = (btScalar (*) [4])0x0;
    }
    else {
      pq_00 = (btScalar (*) [4])
              ((long)*pq_00 +
              (long)*(int *)((long)((((this->m_links).m_data)->m_cachedWorldTransform).m_basis.m_el
                                   + -1) + uVar9) * 4);
    }
    if (pfVar12 == (float *)0x0) {
      pfVar12 = (float *)0x0;
    }
    else {
      pfVar12 = pfVar12 + *(int *)((long)(((this->m_links).m_data)->m_cachedWorldTransform).m_basis.
                                         m_el[0].m_floats + (uVar9 - 0x14));
    }
  }
  return;
}

Assistant:

void btMultiBody::stepPositionsMultiDof(btScalar dt, btScalar *pq, btScalar *pqd)
{	
	int num_links = getNumLinks();
    // step position by adding dt * velocity
	//btVector3 v = getBaseVel();	
    //m_basePos += dt * v;
	//
	btScalar *pBasePos = (pq ? &pq[4] : m_basePos);
	btScalar *pBaseVel = (pqd ? &pqd[3] : &m_realBuf[3]);			//note: the !pqd case assumes m_realBuf holds with base velocity at 3,4,5 (should be wrapped for safety)
	//	
	pBasePos[0] += dt * pBaseVel[0];
	pBasePos[1] += dt * pBaseVel[1];
	pBasePos[2] += dt * pBaseVel[2];

	///////////////////////////////
	//local functor for quaternion integration (to avoid error prone redundancy)
	struct
	{
		//"exponential map" based on btTransformUtil::integrateTransform(..)
		void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}
	} pQuatUpdateFun;
	///////////////////////////////

	//pQuatUpdateFun(getBaseOmega(), m_baseQuat, true, dt);
	//	
	btScalar *pBaseQuat = pq ? pq : m_baseQuat;	
	btScalar *pBaseOmega = pqd ? pqd : &m_realBuf[0];		//note: the !pqd case assumes m_realBuf starts with base omega (should be wrapped for safety)
	//
	static btQuaternion baseQuat; baseQuat.setValue(pBaseQuat[0], pBaseQuat[1], pBaseQuat[2], pBaseQuat[3]);
	static btVector3 baseOmega; baseOmega.setValue(pBaseOmega[0], pBaseOmega[1], pBaseOmega[2]);
	pQuatUpdateFun(baseOmega, baseQuat, true, dt);
	pBaseQuat[0] = baseQuat.x();
	pBaseQuat[1] = baseQuat.y();
	pBaseQuat[2] = baseQuat.z();
	pBaseQuat[3] = baseQuat.w();


	//printf("pBaseOmega = %.4f %.4f %.4f\n", pBaseOmega->x(), pBaseOmega->y(), pBaseOmega->z());
	//printf("pBaseVel = %.4f %.4f %.4f\n", pBaseVel->x(), pBaseVel->y(), pBaseVel->z());
	//printf("baseQuat = %.4f %.4f %.4f %.4f\n", pBaseQuat->x(), pBaseQuat->y(), pBaseQuat->z(), pBaseQuat->w());

	if(pq)		
		pq += 7;
	if(pqd)
		pqd += 6;

	// Finally we can update m_jointPos for each of the m_links
    for (int i = 0; i < num_links; ++i) 
	{
		btScalar *pJointPos = (pq ? pq : &m_links[i].m_jointPos[0]);		
		btScalar *pJointVel = (pqd ? pqd : getJointVelMultiDof(i));

		switch(m_links[i].m_jointType)
		{
			case btMultibodyLink::ePrismatic:
			case btMultibodyLink::eRevolute:
			{
				btScalar jointVel = pJointVel[0];	
				pJointPos[0] += dt * jointVel;
				break;
			}
			case btMultibodyLink::eSpherical:
			{
				static btVector3 jointVel; jointVel.setValue(pJointVel[0], pJointVel[1], pJointVel[2]);
				static btQuaternion jointOri; jointOri.setValue(pJointPos[0], pJointPos[1], pJointPos[2], pJointPos[3]);
				pQuatUpdateFun(jointVel, jointOri, false, dt);
				pJointPos[0] = jointOri.x(); pJointPos[1] = jointOri.y(); pJointPos[2] = jointOri.z(); pJointPos[3] = jointOri.w();
				break;
			}
			case btMultibodyLink::ePlanar:
			{
				pJointPos[0] += dt * getJointVelMultiDof(i)[0];

				btVector3 q0_coors_qd1qd2 = getJointVelMultiDof(i)[1] * m_links[i].getAxisBottom(1) + getJointVelMultiDof(i)[2] * m_links[i].getAxisBottom(2);
				btVector3 no_q0_coors_qd1qd2 = quatRotate(btQuaternion(m_links[i].getAxisTop(0), pJointPos[0]), q0_coors_qd1qd2);
				pJointPos[1] += m_links[i].getAxisBottom(1).dot(no_q0_coors_qd1qd2) * dt;
				pJointPos[2] += m_links[i].getAxisBottom(2).dot(no_q0_coors_qd1qd2) * dt;

				break;
			}
			default:
			{
			}

		}

		m_links[i].updateCacheMultiDof(pq);

		if(pq)		
			pq += m_links[i].m_posVarCount;
		if(pqd)
			pqd += m_links[i].m_dofCount;
    }
}